

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_node * fy_node_copy_internal(fy_document *fyd,fy_node *fyn_from,fy_node *fyn_parent)

{
  byte *pbVar1;
  fy_document *pfVar2;
  list_head *plVar3;
  int iVar4;
  fy_node *fyn_parent_00;
  fy_token *pfVar5;
  fy_anchor *pfVar6;
  list_head *plVar7;
  fy_node *pfVar8;
  char *pcVar9;
  size_t anchor_len;
  
  if ((fyn_from != (fy_node *)0x0 && fyd != (fy_document *)0x0) &&
     (pfVar2 = fyn_from->fyd, pfVar2 != (fy_document *)0x0)) {
    fyn_parent_00 = fy_node_alloc(fyd,(byte)fyn_from->field_0x34 & (FYNT_MAPPING|FYNT_SEQUENCE));
    if (fyn_parent_00 == (fy_node *)0x0) {
      pcVar9 = "fy_node_alloc() failed";
      iVar4 = 0x712;
    }
    else {
      pfVar5 = fy_token_ref(fyn_from->tag);
      fyn_parent_00->tag = pfVar5;
      fyn_parent_00->style = fyn_from->style;
      fyn_parent_00->parent = fyn_parent;
      switch(fyn_parent_00->field_0x34 & 3) {
      case 0:
        pfVar5 = fy_token_ref((fyn_from->field_12).scalar);
        (fyn_parent_00->field_12).scalar = pfVar5;
        break;
      case 1:
        pfVar5 = (fyn_from->field_12).scalar;
        if (pfVar5 != (fy_token *)0x0 && pfVar5 != (fy_token *)&fyn_from->field_12) {
          do {
            pfVar8 = fy_node_copy_internal(fyd,(fy_node *)pfVar5,fyn_parent_00);
            if (pfVar8 == (fy_node *)0x0) {
              pcVar9 = "fy_node_copy_internal() failed";
              iVar4 = 0x723;
              goto LAB_0011e803;
            }
            plVar7 = (fyn_parent_00->field_12).sequence._lh.prev;
            (fyn_parent_00->field_12).sequence._lh.prev = &pfVar8->node;
            (pfVar8->node).next = (list_head *)&fyn_parent_00->field_12;
            (pfVar8->node).prev = plVar7;
            plVar7->next = &pfVar8->node;
            pfVar8->field_0x34 = pfVar8->field_0x34 | 8;
            pfVar5 = (fy_token *)(pfVar5->node).next;
          } while ((pfVar5 != (fy_token *)&fyn_from->field_12) && (pfVar5 != (fy_token *)0x0));
        }
        break;
      case 2:
        pfVar5 = (fyn_from->field_12).scalar;
        if (pfVar5 != (fy_token *)0x0 && pfVar5 != (fy_token *)&fyn_from->field_12) {
          do {
            plVar7 = (list_head *)malloc(0x30);
            if (plVar7 == (list_head *)0x0) {
              pcVar9 = "fy_node_pair_alloc() failed";
              iVar4 = 0x730;
              goto LAB_0011e803;
            }
            plVar7[1].next = (list_head *)0x0;
            plVar7[1].prev = (list_head *)0x0;
            plVar7[2].next = &fyd->node;
            pfVar8 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar5->type,(fy_node *)0x0);
            plVar7[1].next = &pfVar8->node;
            pfVar8 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar5->analyze_flags,fyn_parent_00);
            plVar7[1].prev = &pfVar8->node;
            pfVar5->text = (char *)fyn_parent_00;
            plVar3 = (fyn_parent_00->field_12).sequence._lh.prev;
            (fyn_parent_00->field_12).sequence._lh.prev = plVar7;
            plVar7->next = (list_head *)&fyn_parent_00->field_12;
            plVar7->prev = plVar3;
            plVar3->next = plVar7;
            if ((fyn_parent_00->xl != (fy_accel *)0x0) &&
               (iVar4 = fy_accel_insert(fyn_parent_00->xl,plVar7[1].next,plVar7), iVar4 != 0)) {
              pcVar9 = "fy_accel_insert() failed";
              iVar4 = 0x73a;
              goto LAB_0011e803;
            }
            if (plVar7[1].next != (list_head *)0x0) {
              pbVar1 = (byte *)((long)&plVar7[1].next[3].next + 4);
              *pbVar1 = *pbVar1 | 8;
            }
            if (plVar7[1].prev != (list_head *)0x0) {
              pbVar1 = (byte *)((long)&plVar7[1].prev[3].next + 4);
              *pbVar1 = *pbVar1 | 8;
            }
            pfVar5 = (fy_token *)(pfVar5->node).next;
          } while ((pfVar5 != (fy_token *)&fyn_from->field_12) && (pfVar5 != (fy_token *)0x0));
        }
      }
      plVar7 = (pfVar2->anchors)._lh.next;
      if (plVar7 == (list_head *)0x0 || plVar7 == &(pfVar2->anchors)._lh) {
        return fyn_parent_00;
      }
      while ((fy_node *)plVar7[1].next != fyn_from) {
        plVar7 = plVar7->next;
        if (plVar7 == &(pfVar2->anchors)._lh) {
          return fyn_parent_00;
        }
        if (plVar7 == (list_head *)0x0) {
          return fyn_parent_00;
        }
      }
      pfVar6 = fy_document_lookup_anchor_by_token(fyd,(fy_token *)plVar7[1].prev);
      if (pfVar6 == (fy_anchor *)0x0) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x74f,"fy_node_copy_internal","new anchor");
        iVar4 = fy_document_register_anchor(fyd,fyn_parent_00,(fy_token *)plVar7[1].prev);
        if (iVar4 == 0) {
          fy_token_ref((fy_token *)plVar7[1].prev);
          return fyn_parent_00;
        }
        pcVar9 = "fy_document_register_anchor() failed";
        iVar4 = 0x753;
      }
      else {
        pcVar9 = fy_token_get_text(pfVar6->anchor,&anchor_len);
        if (pcVar9 != (char *)0x0) {
          fy_document_diag(fyd,0x40,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0x75a,"fy_node_copy_internal","not overwritting anchor %.*s",
                           (ulong)(uint)anchor_len,pcVar9);
          return fyn_parent_00;
        }
        pcVar9 = "fy_anchor_get_text() failed";
        iVar4 = 0x759;
      }
    }
LAB_0011e803:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar4,"fy_node_copy_internal",pcVar9);
  }
  return (fy_node *)0x0;
}

Assistant:

struct fy_node *fy_node_copy_internal(struct fy_document *fyd, struct fy_node *fyn_from,
                                      struct fy_node *fyn_parent) {
    struct fy_document *fyd_from;
    struct fy_node *fyn, *fyni, *fynit;
    struct fy_node_pair *fynp, *fynpt;
    struct fy_anchor *fya, *fya_from;
    const char *anchor;
    size_t anchor_len;
    int rc;

    if (!fyd || !fyn_from || !fyn_from->fyd)
        return NULL;

    fyd_from = fyn_from->fyd;

    fyn = fy_node_alloc(fyd, fyn_from->type);
    fyd_error_check(fyd, fyn, err_out,
                    "fy_node_alloc() failed");

    fyn->tag = fy_token_ref(fyn_from->tag);
    fyn->style = fyn_from->style;
    fyn->parent = fyn_parent;

    switch (fyn->type) {
        case FYNT_SCALAR:
            fyn->scalar = fy_token_ref(fyn_from->scalar);
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn_from->sequence); fyni;
                 fyni = fy_node_next(&fyn_from->sequence, fyni)) {

                fynit = fy_node_copy_internal(fyd, fyni, fyn);
                fyd_error_check(fyd, fynit, err_out,
                                "fy_node_copy_internal() failed");

                fy_node_list_add_tail(&fyn->sequence, fynit);
                fynit->attached = true;
            }

            break;
        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn_from->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn_from->mapping, fynp)) {

                fynpt = fy_node_pair_alloc(fyd);
                fyd_error_check(fyd, fynpt, err_out,
                                "fy_node_pair_alloc() failed");

                fynpt->key = fy_node_copy_internal(fyd, fynp->key, NULL);
                fynpt->value = fy_node_copy_internal(fyd, fynp->value, fyn);
                fynp->parent = fyn;

                fy_node_pair_list_add_tail(&fyn->mapping, fynpt);
                if (fyn->xl) {
                    rc = fy_accel_insert(fyn->xl, fynpt->key, fynpt);
                    fyd_error_check(fyd, !rc, err_out,
                                    "fy_accel_insert() failed");
                }
                if (fynpt->key)
                    fynpt->key->attached = true;
                if (fynpt->value)
                    fynpt->value->attached = true;
            }
            break;
    }

    /* drop an anchor to the copy */
    for (fya_from = fy_anchor_list_head(&fyd_from->anchors); fya_from;
         fya_from = fy_anchor_next(&fyd_from->anchors, fya_from)) {
        if (fyn_from == fya_from->fyn)
            break;
    }

    /* source node has an anchor */
    if (fya_from) {
        fya = fy_document_lookup_anchor_by_token(fyd, fya_from->anchor);
        if (!fya) {
            fyd_doc_debug(fyd, "new anchor");
            /* update the new anchor position */
            rc = fy_document_register_anchor(fyd, fyn, fya_from->anchor);
            fyd_error_check(fyd, !rc, err_out,
                            "fy_document_register_anchor() failed");

            fy_token_ref(fya_from->anchor);
        } else {
            anchor = fy_anchor_get_text(fya, &anchor_len);
            fyd_error_check(fyd, anchor, err_out,
                            "fy_anchor_get_text() failed");
            fyd_doc_debug(fyd, "not overwritting anchor %.*s", (int) anchor_len, anchor);
        }
    }

    return fyn;

    err_out:
    return NULL;
}